

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O1

void __thiscall
antlr::ASTFactory::registerFactory(ASTFactory *this,int type,char *ast_name,factory_type factory)

{
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *ppVar1;
  undefined8 *puVar2;
  value_type local_48;
  long local_40;
  pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> local_38;
  
  if (type < 4) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Internal parser error invalid type passed to RegisterFactory",""
              );
    *puVar2 = &PTR__ANTLRException_002fb108;
    puVar2[1] = puVar2 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar2 + 1),local_48,(long)&local_48->first + local_40);
    __cxa_throw(puVar2,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
  }
  if (factory != (factory_type)0x0) {
    if ((ulong)((long)(this->nodeFactories).
                      super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->nodeFactories).
                      super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(type + 1U)) {
      local_48 = &this->default_factory_descriptor;
      std::
      vector<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
      ::resize(&this->nodeFactories,(long)(int)(type + 1U),&local_48);
    }
    ppVar1 = (pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()> *)operator_new(0x10);
    ppVar1->first = ast_name;
    ppVar1->second = (_func_ASTRefCount<antlr::AST> *)factory;
    (this->nodeFactories).
    super__Vector_base<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*,_std::allocator<std::pair<const_char_*,_antlr::ASTRefCount<antlr::AST>_(*)()>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[(uint)type] = ppVar1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Internal parser error 0 factory passed to RegisterFactory","");
  *puVar2 = &PTR__ANTLRException_002fb108;
  puVar2[1] = puVar2 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 1),local_48,(long)&local_48->first + local_40);
  __cxa_throw(puVar2,&ANTLRException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void ASTFactory::registerFactory( int type, const char* ast_name, factory_type factory )
{
	// check validity of arguments...
	if( type < Token::MIN_USER_TYPE )
		throw ANTLRException("Internal parser error invalid type passed to RegisterFactory");
	if( factory == 0 )
		throw ANTLRException("Internal parser error 0 factory passed to RegisterFactory");

	// resize up to and including 'type' and initalize any gaps to default
	// factory.
	if( nodeFactories.size() < (static_cast<unsigned int>(type)+1) )
		nodeFactories.resize( type+1, &default_factory_descriptor );

	// And add new thing..
	nodeFactories[type] = new ANTLR_USE_NAMESPACE(std)pair<const char*, factory_type>( ast_name, factory );
}